

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O1

int TestReintersectConvex(ShapeHandle *shape,RNG *rng)

{
  undefined8 uVar1;
  uint64_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  short sVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  uint uVar9;
  uint uVar10;
  float *pfVar11;
  ulong uVar12;
  Point3f *pPVar13;
  byte bVar14;
  int c;
  int iVar15;
  ShapeHandle *pSVar16;
  Sphere *this;
  Curve *this_00;
  uint64_t uVar17;
  int c_1;
  ulong uVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM2 [64];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 in_XMM7 [16];
  Bounds3f bbox;
  Ray rOut;
  optional<pbrt::ShapeIntersection> si;
  undefined1 local_340 [8];
  Point3f local_338;
  DispatchSplit<6> local_329;
  ulong local_328;
  undefined4 local_31c;
  ShapeHandle *local_318;
  Tuple3<pbrt::Vector3,_float> local_310;
  int local_304;
  float local_300;
  float local_2fc;
  Bounds3f local_2f8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  ulong local_2d0;
  float local_2c8;
  float local_2c4;
  float fStack_2c0;
  float local_2bc;
  undefined4 local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  ulong local_288 [4];
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_268;
  undefined1 local_258 [16];
  RayDifferential local_240 [2];
  byte local_140;
  Interaction local_138 [3];
  char local_38;
  
  local_2d8 = 0;
  local_2fc = 0.0;
  iVar15 = 0;
  local_318 = shape;
  do {
    uVar18 = rng->state;
    rng->state = uVar18 * 0x5851f42d4c957f2d + rng->inc;
    uVar9 = (uint)(uVar18 >> 0x2d) ^ (uint)(uVar18 >> 0x1b);
    bVar14 = (byte)(uVar18 >> 0x3b);
    auVar20 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,uVar9 >> bVar14 | uVar9 << 0x20 - bVar14);
    auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),
                         SUB6416(ZEXT464(0x3f7fffff),0));
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 8.0)),
                              ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc1000000));
    dVar23 = pow(10.0,(double)auVar20._0_4_);
    pSVar16 = local_318;
    auVar20 = in_ZMM2._0_16_;
    pfVar11 = (float *)&local_2d8;
    if ((iVar15 != 0) && (pfVar11 = (float *)((long)&local_2d8 + 4), iVar15 != 1)) {
      pfVar11 = &local_2fc;
    }
    *pfVar11 = (float)dVar23;
    iVar15 = iVar15 + 1;
  } while (iVar15 != 3);
  uVar18 = (local_318->
           super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           ).bits;
  sVar6 = (short)(uVar18 >> 0x30);
  if (uVar18 >> 0x32 == 0) {
    this = (Sphere *)(uVar18 & 0xffffffffffff);
    if (uVar18 >> 0x31 == 0) {
      pbrt::Sphere::Bounds(&local_2f8,this);
    }
    else if (sVar6 == 2) {
      pbrt::Cylinder::Bounds(&local_2f8,(Cylinder *)this);
    }
    else {
      pbrt::Disk::Bounds(&local_2f8,(Disk *)this);
    }
  }
  else {
    this_00 = (Curve *)(uVar18 & 0xffffffffffff);
    if (uVar18 >> 0x30 == 5) {
      pbrt::BilinearPatch::Bounds(&local_2f8,(BilinearPatch *)this_00);
    }
    else if (sVar6 == 4) {
      pbrt::Triangle::Bounds(&local_2f8,(Triangle *)this_00);
    }
    else {
      pbrt::Curve::Bounds(&local_2f8,this_00);
    }
  }
  local_2e0 = 0;
  local_300 = 0.0;
  uVar17 = rng->state;
  uVar2 = rng->inc;
  iVar15 = 0;
  do {
    uVar9 = (uint)(uVar17 >> 0x2d) ^ (uint)(uVar17 >> 0x1b);
    bVar14 = (byte)(uVar17 >> 0x3b);
    auVar26 = vcvtusi2ss_avx512f(auVar20,uVar9 >> bVar14 | uVar9 << 0x20 - bVar14);
    auVar26 = vminss_avx(ZEXT416((uint)(auVar26._0_4_ * 2.3283064e-10)),
                         SUB6416(ZEXT464(0x3f7fffff),0));
    pfVar11 = (float *)&local_2e0;
    if ((iVar15 != 0) && (pfVar11 = (float *)((long)&local_2e0 + 4), iVar15 != 1)) {
      pfVar11 = &local_300;
    }
    uVar17 = uVar17 * 0x5851f42d4c957f2d + uVar2;
    *pfVar11 = auVar26._0_4_;
    iVar15 = iVar15 + 1;
  } while (iVar15 != 3);
  rng->state = uVar17;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_2e0;
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(local_300 *
                                          local_2f8.pMax.super_Tuple3<pbrt::Point3,_float>.z)),
                            ZEXT416((uint)(1.0 - local_300)),
                            ZEXT416((uint)local_2f8.pMin.super_Tuple3<pbrt::Point3,_float>.z));
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_2d8;
  auVar36._8_8_ = 0;
  auVar36._0_4_ = local_2f8.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  auVar36._4_4_ = local_2f8.pMin.super_Tuple3<pbrt::Point3,_float>.y;
  auVar37._8_4_ = 0x3f800000;
  auVar37._0_8_ = 0x3f8000003f800000;
  auVar37._12_4_ = 0x3f800000;
  auVar20 = vsubps_avx(auVar37,auVar20);
  auVar38 = ZEXT1664(auVar20);
  auVar24._0_4_ = (float)local_2e0 * local_2f8.pMax.super_Tuple3<pbrt::Point3,_float>.x;
  auVar24._4_4_ = (float)(local_2e0 >> 0x20) * local_2f8.pMax.super_Tuple3<pbrt::Point3,_float>.y;
  auVar24._8_8_ = 0;
  auVar20 = vfmadd231ps_fma(auVar24,auVar36,auVar20);
  auVar20 = vsubps_avx(auVar20,auVar21);
  local_2bc = auVar26._0_4_ - local_2fc;
  local_2d0 = local_2d8;
  local_2c8 = local_2fc;
  uVar1 = vmovlps_avx(auVar20);
  local_2c4 = (float)uVar1;
  fStack_2c0 = (float)((ulong)uVar1 >> 0x20);
  local_2b8 = 0;
  local_2b0 = 0;
  uVar18 = rng->state;
  uVar9 = (uint)(uVar18 >> 0x2d) ^ (uint)(uVar18 >> 0x1b);
  bVar14 = (byte)(uVar18 >> 0x3b);
  auVar20 = vcvtusi2ss_avx512f(in_XMM7,uVar9 >> bVar14 | uVar9 << 0x20 - bVar14);
  rng->state = uVar18 * 0x5851f42d4c957f2d + rng->inc;
  auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  if (auVar20._0_4_ < 0.5) {
    auVar26._0_4_ = fStack_2c0 * fStack_2c0;
    auVar26._4_4_ = local_2bc * local_2bc;
    auVar26._8_8_ = 0;
    auVar20 = vmovshdup_avx(auVar26);
    fVar22 = local_2c4 * local_2c4 + auVar26._0_4_ + auVar20._0_4_;
    if (fVar22 < 0.0) {
      fVar22 = sqrtf(fVar22);
    }
    else {
      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22));
      fVar22 = auVar20._0_4_;
    }
    auVar30._4_4_ = fStack_2c0;
    auVar30._0_4_ = local_2c4;
    auVar30._8_8_ = 0;
    auVar32._4_4_ = fVar22;
    auVar32._0_4_ = fVar22;
    auVar32._8_4_ = fVar22;
    auVar32._12_4_ = fVar22;
    auVar20 = vdivps_avx(auVar30,auVar32);
    local_2bc = local_2bc / fVar22;
    uVar1 = vmovlps_avx(auVar20);
    local_2c4 = (float)uVar1;
    fStack_2c0 = (float)((ulong)uVar1 >> 0x20);
  }
  local_288[0] = CONCAT44(local_288[0]._4_4_,0x7f800000);
  local_240[0].super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ =
       (pSVar16->
       super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
       ).bits;
  pbrt::DispatchSplit<6>::operator()
            (local_138,(DispatchSplit<6> *)&local_310,&local_2d0,local_288,local_240,
             (ulong)local_240[0].super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ >> 0x30);
  local_338.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  if (local_38 == '\x01') {
    local_338.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    local_304 = 0;
    do {
      uVar18 = rng->state;
      uVar12 = uVar18 * 0x5851f42d4c957f2d + rng->inc;
      rng->state = uVar12 * 0x5851f42d4c957f2d + rng->inc;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar18;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar12;
      auVar26 = vpunpcklqdq_avx(auVar31,auVar25);
      auVar20 = vpsrlvq_avx2(auVar26,_DAT_005655d0);
      auVar24 = vpsrlvq_avx2(auVar26,_DAT_005655c0);
      auVar20 = vpshufd_avx(auVar24 ^ auVar20,0xe8);
      auVar26 = vpsrlq_avx(auVar26,0x3b);
      auVar26 = vpshufd_avx(auVar26,0xe8);
      auVar20 = vprorvd_avx512vl(auVar20,auVar26);
      auVar20 = vcvtudq2ps_avx512vl(auVar20);
      auVar3._8_4_ = 0x2f800000;
      auVar3._0_8_ = 0x2f8000002f800000;
      auVar3._12_4_ = 0x2f800000;
      auVar26 = vmulps_avx512vl(auVar20,auVar3);
      auVar4._8_4_ = 0x3f7fffff;
      auVar4._0_8_ = 0x3f7fffff3f7fffff;
      auVar4._12_4_ = 0x3f7fffff;
      uVar18 = vcmpps_avx512vl(auVar26,auVar4,1);
      bVar14 = (byte)(uVar18 >> 1);
      auVar20 = vmovshdup_avx(auVar26);
      local_2a8._0_4_ = auVar26._0_4_ * 6.2831855;
      local_258 = vfmadd132ss_fma(ZEXT416((uint)(bVar14 & 1) * auVar20._0_4_ +
                                          (uint)!(bool)(bVar14 & 1) * 0x3f7fffff),
                                  SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
      auVar20 = vfnmadd213ss_fma(local_258,local_258,SUB6416(ZEXT464(0x3f800000),0));
      auVar20 = vmaxss_avx(auVar20,ZEXT816(0));
      if (auVar20._0_4_ < 0.0) {
        local_298._0_4_ = (int)uVar18;
        local_2a8 = ZEXT416((uint)local_2a8._0_4_);
        fVar22 = sqrtf(auVar20._0_4_);
        uVar18 = (ulong)(uint)local_298._0_4_;
      }
      else {
        auVar20 = vsqrtss_avx(auVar20,auVar20);
        fVar22 = auVar20._0_4_;
      }
      fVar19 = (float)((uint)((byte)uVar18 & 1) * local_2a8._0_4_ +
                      (uint)!(bool)((byte)uVar18 & 1) * 0x40c90fda);
      local_2a8 = ZEXT416((uint)fVar19);
      fVar19 = cosf(fVar19);
      local_298 = ZEXT416((uint)(fVar19 * fVar22));
      fVar19 = sinf((float)local_2a8._0_4_);
      auVar20 = vinsertps_avx(local_298,ZEXT416((uint)(fVar19 * fVar22)),0x10);
      fVar35 = local_258._0_4_;
      auVar24 = vfmsub213ss_fma(ZEXT416((uint)local_138[0].n.super_Tuple3<pbrt::Normal3,_float>.z),
                                local_258,
                                ZEXT416((uint)(fVar35 * local_138[0].n.
                                                        super_Tuple3<pbrt::Normal3,_float>.z)));
      auVar26 = vfmadd132ss_fma(ZEXT416((uint)(fVar19 * fVar22)),
                                ZEXT416((uint)(fVar35 * local_138[0].n.
                                                        super_Tuple3<pbrt::Normal3,_float>.z)),
                                ZEXT416((uint)local_138[0].n.super_Tuple3<pbrt::Normal3,_float>.y));
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ + auVar24._0_4_)),local_298,
                                ZEXT416((uint)local_138[0].n.super_Tuple3<pbrt::Normal3,_float>.x));
      if (auVar26._0_4_ < 0.0) {
        auVar27._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
        auVar27._8_4_ = auVar20._8_4_ ^ 0x80000000;
        auVar27._12_4_ = auVar20._12_4_ ^ 0x80000000;
        auVar20 = auVar27;
      }
      uVar1 = vcmpss_avx512f(auVar26,ZEXT416(0),1);
      bVar8 = (bool)((byte)uVar1 & 1);
      local_310.z = (float)((uint)bVar8 * (int)-fVar35 + (uint)!bVar8 * (int)fVar35);
      local_310._0_8_ = vmovlps_avx(auVar20);
      pbrt::Interaction::SpawnRay(local_240,local_138,(Vector3f *)&local_310);
      local_288._20_8_ = local_240[0].super_Ray._20_8_;
      local_288[0]._0_4_ = local_240[0].super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
      local_288[0]._4_4_ = local_240[0].super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
      local_268 = local_240[0].super_Ray.medium.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits;
      local_340._0_4_ = INFINITY;
      local_240[0].super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ =
           (pSVar16->
           super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           ).bits;
      bVar8 = pbrt::DispatchSplit<6>::operator()
                        ((DispatchSplit<6> *)&local_328,local_288,local_340,local_240,
                         (ulong)local_240[0].super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ >>
                         0x30);
      local_328 = CONCAT44(local_328._4_4_,0x7f800000);
      local_340 = (undefined1  [8])
                  (pSVar16->
                  super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                  ).bits;
      pbrt::DispatchSplit<6>::operator()
                (local_240,(DispatchSplit<6> *)&local_31c,local_288,(DispatchSplit<6> *)&local_328,
                 local_340,(ulong)local_340 >> 0x30);
      uVar9 = (uint)local_140;
      if (uVar9 != 0) {
        local_140 = 0;
      }
      local_338.super_Tuple3<pbrt::Point3,_float>.z =
           (float)((int)local_338.super_Tuple3<pbrt::Point3,_float>.z + (uint)bVar8);
      local_340 = (undefined1  [8])0x0;
      local_338.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
      iVar15 = 0;
      do {
        uVar18 = rng->state;
        rng->state = uVar18 * 0x5851f42d4c957f2d + rng->inc;
        uVar10 = (uint)(uVar18 >> 0x2d) ^ (uint)(uVar18 >> 0x1b);
        bVar14 = (byte)(uVar18 >> 0x3b);
        auVar20 = vcvtusi2ss_avx512f(auVar38._0_16_,uVar10 >> bVar14 | uVar10 << 0x20 - bVar14);
        auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),
                             SUB6416(ZEXT464(0x3f7fffff),0));
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 8.0)),
                                  ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc1000000));
        dVar23 = pow(10.0,(double)auVar20._0_4_);
        pSVar16 = local_318;
        pPVar13 = (Point3f *)local_340;
        if ((iVar15 != 0) && (pPVar13 = (Point3f *)(local_340 + 4), iVar15 != 1)) {
          pPVar13 = &local_338;
        }
        (pPVar13->super_Tuple3<pbrt::Point3,_float>).x = (float)dVar23;
        iVar15 = iVar15 + 1;
      } while (iVar15 != 3);
      auVar7._4_4_ = local_138[0].pi.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar7._8_4_ = local_138[0].pi.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar7._0_4_ = local_138[0].pi.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar7._12_4_ =
           local_138[0].pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
           .high;
      auVar20 = vinsertps_avx(auVar7,ZEXT416((uint)local_138[0].pi.super_Point3<pbrt::Interval>.
                                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
                                            ),0x10);
      auVar28._0_4_ =
           (float)local_138[0].pi.super_Point3<pbrt::Interval>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval>._4_8_ + auVar20._0_4_;
      auVar28._4_4_ =
           SUB84(local_138[0].pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>._4_8_,4) + auVar20._4_4_;
      auVar28._8_4_ = auVar20._8_4_ + 0.0;
      auVar28._12_4_ = auVar20._12_4_ + 0.0;
      auVar5._8_4_ = 0x3f000000;
      auVar5._0_8_ = 0x3f0000003f000000;
      auVar5._12_4_ = 0x3f000000;
      auVar21 = vmulps_avx512vl(auVar28,auVar5);
      fVar22 = (local_138[0].pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
               local_138[0].pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_340;
      auVar26 = vsubps_avx(auVar33,auVar21);
      local_338.super_Tuple3<pbrt::Point3,_float>.x =
           local_338.super_Tuple3<pbrt::Point3,_float>.x - fVar22;
      auVar20 = vmovshdup_avx(auVar26);
      auVar20 = vfmadd132ss_fma(auVar20,ZEXT416((uint)(local_338.super_Tuple3<pbrt::Point3,_float>.x
                                                      * local_138[0].n.
                                                        super_Tuple3<pbrt::Normal3,_float>.z)),
                                ZEXT416((uint)local_138[0].n.super_Tuple3<pbrt::Normal3,_float>.y));
      auVar38 = ZEXT1664(auVar20);
      auVar24 = vfmsub213ss_fma(ZEXT416((uint)local_138[0].n.super_Tuple3<pbrt::Normal3,_float>.z),
                                ZEXT416((uint)local_338.super_Tuple3<pbrt::Point3,_float>.x),
                                ZEXT416((uint)(local_338.super_Tuple3<pbrt::Point3,_float>.x *
                                              local_138[0].n.super_Tuple3<pbrt::Normal3,_float>.z)))
      ;
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ + auVar24._0_4_)),auVar26,
                                ZEXT416((uint)local_138[0].n.super_Tuple3<pbrt::Normal3,_float>.x));
      if (auVar20._0_4_ < 0.0) {
        auVar34._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
        auVar34._8_4_ = auVar26._8_4_ ^ 0x80000000;
        auVar34._12_4_ = auVar26._12_4_ ^ 0x80000000;
        auVar26 = auVar34;
      }
      uVar1 = vcmpss_avx512f(auVar20,ZEXT416(0),1);
      bVar8 = (bool)((byte)uVar1 & 1);
      local_310.z = (float)((uint)bVar8 * (int)-local_338.super_Tuple3<pbrt::Point3,_float>.x +
                           (uint)!bVar8 * (int)local_338.super_Tuple3<pbrt::Point3,_float>.x);
      local_310._0_8_ = vmovlps_avx(auVar26);
      auVar29._0_4_ = auVar21._0_4_ + auVar26._0_4_;
      auVar29._4_4_ = auVar21._4_4_ + auVar26._4_4_;
      auVar29._8_4_ = auVar21._8_4_ + auVar26._8_4_;
      auVar29._12_4_ = auVar21._12_4_ + auVar26._12_4_;
      local_338.super_Tuple3<pbrt::Point3,_float>.x = fVar22 + local_310.z;
      local_340 = (undefined1  [8])vmovlps_avx(auVar29);
      pbrt::Interaction::SpawnRayTo(&local_240[0].super_Ray,local_138,(Point3f *)local_340);
      local_288._20_8_ = local_240[0].super_Ray._20_8_;
      local_288[0]._0_4_ = local_240[0].super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
      local_288[0]._4_4_ = local_240[0].super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
      local_268 = local_240[0].super_Ray.medium.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits;
      local_328 = CONCAT44(local_328._4_4_,0x3f800000);
      local_240[0].super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ =
           (pSVar16->
           super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           ).bits;
      bVar8 = pbrt::DispatchSplit<6>::operator()
                        ((DispatchSplit<6> *)&local_31c,local_288,&local_328,local_240,
                         (ulong)local_240[0].super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ >>
                         0x30);
      local_31c = 0x3f800000;
      local_328 = (pSVar16->
                  super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                  ).bits;
      pbrt::DispatchSplit<6>::operator()
                (local_240,&local_329,local_288,(DispatchSplit<6> *)&local_31c,&local_328,
                 local_328 >> 0x30);
      bVar14 = local_140;
      if (local_140 != 0) {
        local_140 = 0;
      }
      local_338.super_Tuple3<pbrt::Point3,_float>.z =
           (float)((uint)bVar8 + (int)local_338.super_Tuple3<pbrt::Point3,_float>.z + uVar9 +
                  (uint)bVar14);
      local_304 = local_304 + 1;
      pSVar16 = local_318;
    } while (local_304 != 1000);
  }
  return (int)local_338.super_Tuple3<pbrt::Point3,_float>.z;
}

Assistant:

static int TestReintersectConvex(ShapeHandle shape, RNG &rng) {
    // Ray origin
    Point3f o;
    for (int c = 0; c < 3; ++c)
        o[c] = pExp(rng);

    // Destination: a random point in the shape's bounding box.
    Bounds3f bbox = shape.Bounds();
    Point3f t;
    for (int c = 0; c < 3; ++c)
        t[c] = rng.Uniform<Float>();
    Point3f p2 = bbox.Lerp(t);

    // Ray to intersect with the shape.
    Ray r(o, p2 - o);
    if (rng.Uniform<Float>() < .5)
        r.d = Normalize(r.d);

    // We should usually (but not always) find an intersection.
    auto si = shape.Intersect(r);
    if (!si)
        return 0;
    SurfaceInteraction &isect = si->intr;

    // Now trace a bunch of rays leaving the intersection point.
    int n = 0;
    for (int j = 0; j < 1000; ++j) {
        // Random direction leaving the intersection point.
        Point2f u;
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        Vector3f w = SampleUniformSphere(u);
        // Make sure it's in the same hemisphere as the surface normal.
        w = FaceForward(w, isect.n);
        Ray rOut = isect.SpawnRay(w);

        if (shape.IntersectP(rOut))
            ++n;
        if (shape.Intersect(rOut).has_value())
            ++n;

        // Choose a random point to trace rays to.
        Point3f p2;
        for (int c = 0; c < 3; ++c)
            p2[c] = pExp(rng);
        // Make sure that the point we're tracing rays toward is in the
        // hemisphere about the intersection point's surface normal.
        w = p2 - isect.p();
        w = FaceForward(w, isect.n);
        p2 = isect.p() + w;
        rOut = isect.SpawnRayTo(p2);

        if (shape.IntersectP(rOut, 1))
            ++n;
        if (shape.Intersect(rOut, 1).has_value())
            ++n;
    }

    return n;
}